

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.cpp
# Opt level: O0

int __thiscall ncnn::Quantize::load_model(Quantize *this,ModelBin *mb)

{
  int *piVar1;
  void **ppvVar2;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  void *local_e8;
  int *local_e0;
  long *local_c8;
  int local_8c;
  int local_88;
  undefined4 local_84;
  void **local_80;
  void **local_78;
  void **local_70;
  void **local_68;
  int local_40;
  undefined4 local_3c;
  void **local_38;
  int local_30;
  undefined4 local_2c;
  void **local_28;
  void *local_20;
  
  (**(code **)(*in_RSI + 0x10))(&local_e8,in_RSI,*(undefined4 *)(in_RDI + 0xd0),1);
  ppvVar2 = (void **)(in_RDI + 0xd8);
  local_80 = &local_e8;
  local_78 = ppvVar2;
  if (ppvVar2 != local_80) {
    if (local_e0 != (int *)0x0) {
      local_84 = 1;
      LOCK();
      local_88 = *local_e0;
      *local_e0 = *local_e0 + 1;
      UNLOCK();
    }
    local_28 = ppvVar2;
    if (*(long *)(in_RDI + 0xe0) != 0) {
      piVar1 = *(int **)(in_RDI + 0xe0);
      local_2c = 0xffffffff;
      LOCK();
      local_30 = *piVar1;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (local_30 == 1) {
        if (*(long *)(in_RDI + 0xf8) == 0) {
          local_20 = *ppvVar2;
          if (local_20 != (void *)0x0) {
            free(local_20);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0xf8) + 0x18))(*(long **)(in_RDI + 0xf8),*ppvVar2);
        }
      }
    }
    *ppvVar2 = (void *)0x0;
    *(undefined8 *)(in_RDI + 0xe8) = 0;
    *(undefined4 *)(in_RDI + 0xf0) = 0;
    *(undefined4 *)(in_RDI + 0x100) = 0;
    *(undefined4 *)(in_RDI + 0x104) = 0;
    *(undefined4 *)(in_RDI + 0x108) = 0;
    *(undefined4 *)(in_RDI + 0x10c) = 0;
    *(undefined4 *)(in_RDI + 0x110) = 0;
    *(undefined8 *)(in_RDI + 0x118) = 0;
    *(undefined8 *)(in_RDI + 0xe0) = 0;
    *ppvVar2 = *local_80;
    *(void **)(in_RDI + 0xe0) = local_80[1];
    *(void **)(in_RDI + 0xe8) = local_80[2];
    *(undefined4 *)(in_RDI + 0xf0) = *(undefined4 *)(local_80 + 3);
    *(void **)(in_RDI + 0xf8) = local_80[4];
    *(undefined4 *)(in_RDI + 0x100) = *(undefined4 *)(local_80 + 5);
    *(undefined4 *)(in_RDI + 0x104) = *(undefined4 *)((long)local_80 + 0x2c);
    *(undefined4 *)(in_RDI + 0x108) = *(undefined4 *)(local_80 + 6);
    *(undefined4 *)(in_RDI + 0x10c) = *(undefined4 *)((long)local_80 + 0x34);
    *(undefined4 *)(in_RDI + 0x110) = *(undefined4 *)(local_80 + 7);
    *(void **)(in_RDI + 0x118) = local_80[8];
  }
  local_68 = &local_e8;
  if (local_e0 != (int *)0x0) {
    local_3c = 0xffffffff;
    LOCK();
    local_40 = *local_e0;
    *local_e0 = *local_e0 + -1;
    UNLOCK();
    if (local_40 == 1) {
      local_70 = ppvVar2;
      local_38 = local_68;
      if (local_c8 == (long *)0x0) {
        if (local_e8 != (void *)0x0) {
          free(local_e8);
        }
      }
      else {
        (**(code **)(*local_c8 + 0x18))(local_c8,local_e8);
      }
    }
  }
  bVar3 = true;
  if (*(long *)(in_RDI + 0xd8) != 0) {
    bVar3 = *(long *)(in_RDI + 0x118) * (long)*(int *)(in_RDI + 0x110) == 0;
  }
  if (bVar3) {
    local_8c = -100;
  }
  else {
    local_8c = 0;
  }
  return local_8c;
}

Assistant:

int Quantize::load_model(const ModelBin& mb)
{
    scale_data = mb.load(scale_data_size, 1);
    if (scale_data.empty())
        return -100;

    return 0;
}